

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::FormatStrSS<std::__cxx11::stringstream,char[29],std::__cxx11::string>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [29],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *RestArgs_local;
  char (*FirstArg_local) [29];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[29]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,std::__cxx11::string>(ss,RestArgs);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}